

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int compression_code_gzip(archive *a,la_zstream_conflict *lastrm,la_zaction action)

{
  undefined8 *puVar1;
  uint uVar2;
  
  puVar1 = (undefined8 *)lastrm->real_stream;
  *puVar1 = lastrm->next_in;
  *(int *)(puVar1 + 1) = (int)lastrm->avail_in;
  puVar1[2] = lastrm->total_in;
  puVar1[3] = lastrm->next_out;
  *(int *)(puVar1 + 4) = (int)lastrm->avail_out;
  puVar1[5] = lastrm->total_out;
  uVar2 = deflate(puVar1,(ulong)(action == ARCHIVE_Z_FINISH) << 2);
  lastrm->next_in = (uchar *)*puVar1;
  lastrm->avail_in = (ulong)*(uint *)(puVar1 + 1);
  lastrm->total_in = puVar1[2];
  lastrm->next_out = (uchar *)puVar1[3];
  lastrm->avail_out = (ulong)*(uint *)(puVar1 + 4);
  lastrm->total_out = puVar1[5];
  if (1 < uVar2) {
    archive_set_error(a,-1,"GZip compression failed: deflate() call returned status %d",(ulong)uVar2
                     );
    uVar2 = 0xffffffe2;
  }
  return uVar2;
}

Assistant:

static int
compression_code_gzip(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	r = deflate(strm,
	    (action == ARCHIVE_Z_FINISH)? Z_FINISH: Z_NO_FLUSH);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case Z_OK:
		return (ARCHIVE_OK);
	case Z_STREAM_END:
		return (ARCHIVE_EOF);
	default:
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "GZip compression failed:"
		    " deflate() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}